

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::load_block_16_8_8(jpeg_encoder *this,int x,int c)

{
  byte *pbVar1;
  int local_2c;
  sample_array_t *psStack_28;
  int i;
  sample_array_t *pDst;
  uint8 *pSrc1;
  int c_local;
  int x_local;
  jpeg_encoder *this_local;
  
  psStack_28 = this->m_sample_array;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    pbVar1 = this->m_mcu_lines[local_2c] + (x * 0x30 + c);
    *psStack_28 = ((int)((uint)*pbVar1 + (uint)pbVar1[3]) >> 1) + -0x80;
    psStack_28[1] = ((int)((uint)pbVar1[6] + (uint)pbVar1[9]) >> 1) + -0x80;
    psStack_28[2] = ((int)((uint)pbVar1[0xc] + (uint)pbVar1[0xf]) >> 1) + -0x80;
    psStack_28[3] = ((int)((uint)pbVar1[0x12] + (uint)pbVar1[0x15]) >> 1) + -0x80;
    psStack_28[4] = ((int)((uint)pbVar1[0x18] + (uint)pbVar1[0x1b]) >> 1) + -0x80;
    psStack_28[5] = ((int)((uint)pbVar1[0x1e] + (uint)pbVar1[0x21]) >> 1) + -0x80;
    psStack_28[6] = ((int)((uint)pbVar1[0x24] + (uint)pbVar1[0x27]) >> 1) + -0x80;
    psStack_28[7] = ((int)((uint)pbVar1[0x2a] + (uint)pbVar1[0x2d]) >> 1) + -0x80;
    psStack_28 = psStack_28 + 8;
  }
  return;
}

Assistant:

void jpeg_encoder::load_block_16_8_8(int x, int c)
{
  uint8 *pSrc1;
  sample_array_t *pDst = m_sample_array;
  x = (x * (16 * 3)) + c;
  for (int i = 0; i < 8; i++, pDst += 8)
  {
    pSrc1 = m_mcu_lines[i + 0] + x;
    pDst[0] = ((pSrc1[ 0 * 3] + pSrc1[ 1 * 3]) >> 1) - 128; pDst[1] = ((pSrc1[ 2 * 3] + pSrc1[ 3 * 3]) >> 1) - 128;
    pDst[2] = ((pSrc1[ 4 * 3] + pSrc1[ 5 * 3]) >> 1) - 128; pDst[3] = ((pSrc1[ 6 * 3] + pSrc1[ 7 * 3]) >> 1) - 128;
    pDst[4] = ((pSrc1[ 8 * 3] + pSrc1[ 9 * 3]) >> 1) - 128; pDst[5] = ((pSrc1[10 * 3] + pSrc1[11 * 3]) >> 1) - 128;
    pDst[6] = ((pSrc1[12 * 3] + pSrc1[13 * 3]) >> 1) - 128; pDst[7] = ((pSrc1[14 * 3] + pSrc1[15 * 3]) >> 1) - 128;
  }
}